

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# empty.c
# Opt level: O2

int thread_main(void *data)

{
  timespec time;
  timespec local_18;
  
  while (running != '\0') {
    clock_gettime(0,&local_18);
    local_18.tv_sec = local_18.tv_sec + 1;
    thrd_sleep((timespec *)&local_18,(timespec *)0x0);
    glfwPostEmptyEvent();
  }
  return 0;
}

Assistant:

static int thread_main(void* data)
{
    struct timespec time;

    while (running)
    {
        clock_gettime(CLOCK_REALTIME, &time);
        time.tv_sec += 1;
        thrd_sleep(&time, NULL);

        glfwPostEmptyEvent();
    }

    return 0;
}